

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O2

void Fxu_HeapDoubleMoveDn(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  Fxu_Double *pFVar1;
  Fxu_Double **ppFVar2;
  uint uVar3;
  Fxu_Double **pDiv1;
  Fxu_Double **pDiv2;
  
  pDiv1 = p->pTree + pDiv->HNum;
  do {
    pFVar1 = *pDiv1;
    uVar3 = pFVar1->HNum * 2;
    if (p->nItems < (int)uVar3) {
      return;
    }
    ppFVar2 = p->pTree;
    pDiv2 = ppFVar2 + (int)uVar3;
    if ((int)uVar3 < p->nItems) {
      if (((*pDiv2)->Weight <= pFVar1->Weight) &&
         (ppFVar2[(int)(uVar3 | 1)]->Weight <= pFVar1->Weight)) {
        return;
      }
      if ((*pDiv2)->Weight < ppFVar2[(int)(uVar3 | 1)]->Weight) {
        pDiv2 = ppFVar2 + (int)(uVar3 | 1);
      }
    }
    else if ((*pDiv2)->Weight <= pFVar1->Weight) {
      return;
    }
    Fxu_HeapDoubleSwap(pDiv1,pDiv2);
    pDiv1 = pDiv2;
  } while( true );
}

Assistant:

void Fxu_HeapDoubleMoveDn( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
    Fxu_Double ** ppChild1, ** ppChild2, ** ppDiv;
    ppDiv = &FXU_HEAP_DOUBLE_CURRENT(p, pDiv);
    while ( FXU_HEAP_DOUBLE_CHILD1_EXISTS(p,*ppDiv) )
    { // if Child1 does not exist, Child2 also does not exists

        // get the children
        ppChild1 = &FXU_HEAP_DOUBLE_CHILD1(p,*ppDiv);
        if ( FXU_HEAP_DOUBLE_CHILD2_EXISTS(p,*ppDiv) )
        {
            ppChild2 = &FXU_HEAP_DOUBLE_CHILD2(p,*ppDiv);

            // consider two cases
            if ( FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild1) &&
                 FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild2) )
            { // Div is larger than both, skip
                break;
            }
            else
            { // Div is smaller than one of them, then swap it with larger 
                if ( FXU_HEAP_DOUBLE_WEIGHT(*ppChild1) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild2) )
                {
                    Fxu_HeapDoubleSwap( ppDiv, ppChild1 );
                    // update the pointer
                    ppDiv = ppChild1;
                }
                else
                {
                    Fxu_HeapDoubleSwap( ppDiv, ppChild2 );
                    // update the pointer
                    ppDiv = ppChild2;
                }
            }
        }
        else // Child2 does not exist
        {
            // consider two cases
            if ( FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild1) )
            { // Div is larger than Child1, skip
                break;
            }
            else
            { // Div is smaller than Child1, then swap them
                Fxu_HeapDoubleSwap( ppDiv, ppChild1 );
                // update the pointer
                ppDiv = ppChild1;
            }
        }
    }
}